

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.hh
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
State::ghosts_in_position
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,State *this,Position *pos)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint local_2c;
  uint local_28;
  undefined1 local_21;
  uint i;
  Position *pos_local;
  State *this_local;
  vector<int,_std::allocator<int>_> *ghosts_pos;
  
  local_21 = 0;
  _i = pos;
  pos_local = (Position *)this;
  this_local = (State *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  for (local_28 = 0; uVar1 = (ulong)local_28,
      sVar2 = std::vector<Ghost_State,_std::allocator<Ghost_State>_>::size(&this->ghosts),
      uVar1 < sVar2; local_28 = local_28 + 1) {
    pvVar3 = std::vector<Ghost_State,_std::allocator<Ghost_State>_>::operator[]
                       (&this->ghosts,(ulong)local_28);
    if (((pvVar3->super_Agent_State).pos.i == _i->i) &&
       (pvVar3 = std::vector<Ghost_State,_std::allocator<Ghost_State>_>::operator[]
                           (&this->ghosts,(ulong)local_28),
       (pvVar3->super_Agent_State).pos.j == _i->j)) {
      local_2c = local_28;
      std::vector<int,_std::allocator<int>_>::push_back
                (__return_storage_ptr__,(value_type_conflict1 *)&local_2c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline vector<int> ghosts_in_position(const Position& pos) const {
        vector<int> ghosts_pos;

        for (uint i = 0; i < ghosts.size(); ++i) {
            if (ghosts[i].pos.i == pos.i and ghosts[i].pos.j == pos.j)
                ghosts_pos.push_back(i);
        }

        return ghosts_pos;
    }